

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# az.cpp
# Opt level: O3

string * arbiter::drivers::AZ::Config::extractStorageAccessKey
                   (string *__return_storage_ptr__,string *s)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first;
  long *plVar1;
  undefined8 *puVar2;
  bool bVar3;
  size_type sVar4;
  const_reference this;
  pointer *__ptr;
  element_type *peVar5;
  json c;
  arbiter local_88;
  undefined7 uStack_87;
  undefined1 local_80 [32];
  long *local_60;
  undefined1 local_58 [8];
  json_value local_50;
  _Any_data local_48;
  code *local_38;
  undefined8 uStack_30;
  
  if (s->_M_string_length == 0) {
    local_58[0] = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   )0x0;
    local_50.object = (object_t *)0x0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_58);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_58);
  }
  else {
    first._M_current = (s->_M_dataplus)._M_p;
    nlohmann::detail::input_adapter::
    input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
              ((input_adapter *)local_80,first,
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(first._M_current + s->_M_string_length));
    local_38 = (code *)0x0;
    uStack_30 = 0;
    local_48._M_unused._M_object = (void *)0x0;
    local_48._8_8_ = 0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::parse((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             *)local_58,(input_adapter *)local_80,(parser_callback_t *)&local_48,true);
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_);
    }
  }
  if ((local_58[0] ==
       (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
        )0x0) ||
     (sVar4 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              ::count<char_const(&)[4]>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          *)local_58,(char (*) [4])0x17878b), sVar4 == 0)) {
    peVar5 = (element_type *)(local_80 + 0x10);
    local_80._0_8_ = peVar5;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_80,"AZURE_STORAGE_ACCESS_KEY","");
    env(&local_88,(string *)local_80);
    if ((element_type *)local_80._0_8_ != peVar5) {
      operator_delete((void *)local_80._0_8_);
    }
    plVar1 = (long *)CONCAT71(uStack_87,local_88);
    if (plVar1 == (long *)0x0) {
      local_80._0_8_ = peVar5;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_80,"AZ_STORAGE_ACCESS_KEY","");
      env((arbiter *)&local_60,(string *)local_80);
      if ((element_type *)local_80._0_8_ != peVar5) {
        operator_delete((void *)local_80._0_8_);
      }
      plVar1 = local_60;
      if (local_60 != (long *)0x0) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,*local_60,local_60[1] + *local_60);
        if (local_60 != (long *)0x0) {
          if ((long *)*local_60 != local_60 + 2) {
            operator_delete((long *)*local_60);
          }
          operator_delete(local_60);
        }
      }
      puVar2 = (undefined8 *)CONCAT71(uStack_87,local_88);
      if (puVar2 != (undefined8 *)0x0) {
        if ((undefined8 *)*puVar2 != puVar2 + 2) {
          operator_delete((undefined8 *)*puVar2);
        }
        operator_delete(puVar2);
      }
      if (plVar1 == (long *)0x0) {
        if (local_58[0] !=
            (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             )0x0) {
          local_80._0_8_ = peVar5;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"verbose","");
          local_88 = (arbiter)0x0;
          bVar3 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  ::value<bool,_0>((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                    *)local_58,(key_type *)local_80,(bool *)&local_88);
          if ((element_type *)local_80._0_8_ != peVar5) {
            operator_delete((void *)local_80._0_8_);
          }
          if (bVar3) {
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&::std::cout,
                       "access key not found - request signin will be disable",0x35);
            ::std::ios::widen((char)*(undefined8 *)(::std::cout + -0x18) + 'H');
            ::std::ostream::put('H');
            ::std::ostream::flush();
          }
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      }
      goto LAB_00167276;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,*plVar1,plVar1[1] + *plVar1);
    peVar5 = (element_type *)CONCAT71(uStack_87,local_88);
    if (peVar5 == (element_type *)0x0) goto LAB_00167276;
    if ((element_type *)peVar5->_vptr_input_adapter_protocol != peVar5 + 2) {
      operator_delete((element_type *)peVar5->_vptr_input_adapter_protocol);
    }
  }
  else {
    local_80._0_8_ = (element_type *)(local_80 + 0x10);
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"key","");
    this = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)local_58,(key_type *)local_80);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,this);
    peVar5 = (element_type *)local_80._0_8_;
    if ((element_type *)local_80._0_8_ == (element_type *)(local_80 + 0x10)) goto LAB_00167276;
  }
  operator_delete(peVar5);
LAB_00167276:
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_58);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_58 + 8),(value_t)local_58[0]);
  return __return_storage_ptr__;
}

Assistant:

std::string AZ::Config::extractStorageAccessKey(const std::string s)
{
    const json c(s.size() ? json::parse(s) : json());

    if (!c.is_null() && c.count("key"))
    {
        return c.at("key").get<std::string>();
    }
    else if (auto p = env("AZURE_STORAGE_ACCESS_KEY"))
    {
        return *p;
    }
    else if (auto p = env("AZ_STORAGE_ACCESS_KEY"))
    {
        return *p;
    }

    if (!c.is_null() && c.value("verbose", false))
    {
        std::cout << "access key not found - request signin will be disable" << std::endl;
    }

    return "";
}